

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  undefined1 uVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  long *plVar11;
  ulong uVar12;
  uint uVar13;
  ushort uVar14;
  ushort uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar18 = 0;
  if (0 < iVar2 && 0 < iVar1) {
    uVar16 = 0;
    do {
      puVar3 = (x1->high_low_container).keys;
      uVar17 = (uint)uVar18;
      uVar13 = uVar17 & 0xffff;
      uVar14 = puVar3[uVar13];
      puVar4 = (x2->high_low_container).keys;
      uVar8 = (uint)uVar16;
      uVar12 = (ulong)(uVar8 & 0xffff);
      uVar15 = puVar4[uVar12];
      if (uVar14 == uVar15) {
        bVar7 = (x1->high_low_container).typecodes[uVar13];
        if (bVar7 == 4) {
          bVar7 = *(byte *)((long)(x1->high_low_container).containers[uVar13] + 8);
        }
        bVar9 = (x2->high_low_container).typecodes[uVar12];
        plVar11 = (long *)(x2->high_low_container).containers[uVar12];
        if (bVar9 == 4) {
          bVar9 = *(byte *)(plVar11 + 1);
          plVar11 = (long *)*plVar11;
        }
        uVar5 = (*(code *)(&DAT_00124594 +
                          *(int *)(&DAT_00124594 + (ulong)(((uint)bVar9 + (uint)bVar7 * 4) - 5) * 4)
                          ))(uVar12,plVar11,&DAT_00124594,
                             &DAT_00124594 +
                             *(int *)(&DAT_00124594 +
                                     (ulong)(((uint)bVar9 + (uint)bVar7 * 4) - 5) * 4));
        return (_Bool)uVar5;
      }
      if (uVar14 < uVar15) {
        uVar13 = (x1->high_low_container).size;
        uVar8 = uVar17 + 1;
        if (((int)uVar8 < (int)uVar13) && (puVar3[(int)uVar8] < uVar15)) {
          uVar17 = uVar17 + 2;
          iVar10 = 1;
          if ((int)uVar17 < (int)uVar13) {
            iVar10 = 1;
            do {
              uVar18 = (ulong)uVar17;
              uVar14 = puVar3[(int)uVar17];
              if (uVar15 <= uVar14) goto LAB_0010b02a;
              iVar6 = iVar10 * 2;
              uVar17 = uVar8 + iVar10 * 2;
              iVar10 = iVar6;
            } while ((int)uVar17 < (int)uVar13);
          }
          uVar14 = puVar3[(long)(int)uVar13 + -1];
          uVar18 = (long)(int)uVar13 - 1;
LAB_0010b02a:
          if (uVar14 != uVar15) {
            if (uVar14 < uVar15) {
              uVar18 = (ulong)uVar13;
            }
            else if ((iVar10 >> 1) + uVar8 + 1 != (int)uVar18) {
              uVar8 = (iVar10 >> 1) + uVar8;
              do {
                uVar17 = (int)(uVar8 + (int)uVar18) >> 1;
                if (puVar3[(int)uVar17] == uVar15) {
                  uVar18 = (ulong)uVar17;
                  break;
                }
                if (uVar15 <= puVar3[(int)uVar17]) {
                  uVar18 = (ulong)uVar17;
                  uVar17 = uVar8;
                }
                uVar8 = uVar17;
              } while (uVar8 + 1 != (int)uVar18);
            }
          }
        }
        else {
          uVar18 = (ulong)uVar8;
        }
      }
      else {
        uVar17 = (x2->high_low_container).size;
        uVar13 = uVar8 + 1;
        if (((int)uVar13 < (int)uVar17) && (puVar4[(int)uVar13] < uVar14)) {
          uVar8 = uVar8 + 2;
          iVar10 = 1;
          if ((int)uVar8 < (int)uVar17) {
            iVar6 = 1;
            do {
              uVar16 = (ulong)uVar8;
              uVar15 = puVar4[(int)uVar8];
              iVar10 = iVar6;
              if (uVar14 <= uVar15) goto LAB_0010b099;
              iVar10 = iVar6 * 2;
              uVar8 = uVar13 + iVar6 * 2;
              iVar6 = iVar10;
            } while ((int)uVar8 < (int)uVar17);
          }
          uVar15 = puVar4[(long)(int)uVar17 + -1];
          uVar16 = (long)(int)uVar17 - 1;
LAB_0010b099:
          if (uVar15 != uVar14) {
            if (uVar15 < uVar14) {
              uVar16 = (ulong)uVar17;
            }
            else if ((iVar10 >> 1) + uVar13 + 1 != (int)uVar16) {
              uVar13 = (iVar10 >> 1) + uVar13;
              do {
                uVar17 = (int)(uVar13 + (int)uVar16) >> 1;
                if (puVar4[(int)uVar17] == uVar14) {
                  uVar16 = (ulong)uVar17;
                  break;
                }
                if (uVar14 <= puVar4[(int)uVar17]) {
                  uVar16 = (ulong)uVar17;
                  uVar17 = uVar13;
                }
                uVar13 = uVar17;
              } while (uVar13 + 1 != (int)uVar16);
            }
          }
        }
        else {
          uVar16 = (ulong)uVar13;
        }
      }
    } while (((int)uVar18 < iVar1) && ((int)uVar16 < iVar2));
  }
  return false;
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                              const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            if (container_intersect(c1, type1, c2, type2)) return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}